

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O1

nb_type * __thiscall libDAI::NDP::NBFromVarSet(nb_type *__return_storage_ptr__,NDP *this,VarSet *vs)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  pointer pVVar4;
  allocator_type local_29;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,
             (long)(vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4,&local_29);
  pVVar4 = (vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar4 != (vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    uVar3 = 0;
    do {
      iVar2 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[8])(this->_g,pVVar4);
      puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(__return_storage_ptr__->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                  );
      }
      puVar1[uVar3] = CONCAT44(extraout_var,iVar2);
      pVVar4 = pVVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (pVVar4 != (vs->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

nb_type NBFromVarSet(const VarSet & vs) const
            {
                nb_type n(vs.size());
                VarSet::const_iterator it = vs.begin();
                for(size_t i=0; it != vs.end(); it++, i++)
                {
                    const Var & v = *it;
                    size_t vI = _g->findVar(v);
                    n.at(i) = vI;
                }
                return n;
            }